

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# events.c
# Opt level: O1

void al_unregister_event_source(ALLEGRO_EVENT_QUEUE *queue,ALLEGRO_EVENT_SOURCE *source)

{
  _AL_VECTOR *vec;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ALLEGRO_EVENT_SOURCE *pAVar3;
  int iVar4;
  _Bool _Var5;
  void *pvVar6;
  ALLEGRO_USER_EVENT *event;
  undefined8 *puVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  bool bVar12;
  byte bVar13;
  _AL_VECTOR old_events;
  ALLEGRO_EVENT_SOURCE *local_60;
  _AL_VECTOR local_58;
  
  bVar13 = 0;
  local_60 = source;
  if ((queue->mutex).inited == true) {
    pthread_mutex_lock((pthread_mutex_t *)&(queue->mutex).mutex);
  }
  _Var5 = _al_vector_find_and_delete(&queue->sources,&local_60);
  if ((queue->mutex).inited == true) {
    pthread_mutex_unlock((pthread_mutex_t *)&(queue->mutex).mutex);
  }
  if (_Var5) {
    _al_event_source_on_unregistration_from_queue(local_60,queue);
    if ((queue->mutex).inited == true) {
      pthread_mutex_lock((pthread_mutex_t *)&(queue->mutex).mutex);
    }
    pAVar3 = local_60;
    uVar10 = (ulong)queue->events_tail;
    vec = &queue->events;
    bVar12 = queue->events_tail == queue->events_head;
    while (!bVar12) {
      pvVar6 = _al_vector_ref(vec,(uint)uVar10);
      if (*(ALLEGRO_EVENT_SOURCE **)((long)pvVar6 + 8) == pAVar3) goto LAB_00158d7d;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (queue->events)._size;
      auVar1 = ZEXT416((uint)uVar10 + 1) % auVar1;
      uVar10 = auVar1._0_8_;
      bVar12 = queue->events_head == auVar1._0_4_;
    }
    if (!bVar12) {
LAB_00158d7d:
      local_58._itemsize = vec->_itemsize;
      local_58._items = (queue->events)._items;
      local_58._size = (queue->events)._size;
      local_58._unused = (queue->events)._unused;
      _al_vector_init(vec,0x48);
      uVar10 = (ulong)queue->events_tail;
      if (queue->events_tail != queue->events_head) {
        do {
          event = (ALLEGRO_USER_EVENT *)_al_vector_ref(&local_58,(uint)uVar10);
          if (event->source == pAVar3) {
            if (0x1ff < event->type) {
              al_unref_user_event(event);
            }
          }
          else {
            puVar7 = (undefined8 *)_al_vector_alloc_back(vec);
            for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
              *puVar7 = *(undefined8 *)event;
              event = (ALLEGRO_USER_EVENT *)((long)event + (ulong)bVar13 * -0x10 + 8);
              puVar7 = puVar7 + (ulong)bVar13 * -2 + 1;
            }
          }
          auVar2._8_8_ = 0;
          auVar2._0_8_ = local_58._size;
          auVar2 = ZEXT416((uint)uVar10 + 1) % auVar2;
          uVar10 = auVar2._0_8_;
        } while (queue->events_head != auVar2._0_4_);
      }
      queue->events_tail = 0;
      uVar10 = (queue->events)._size;
      uVar11 = (uint)uVar10;
      uVar10 = uVar10 & 0xffffffff;
      queue->events_head = uVar11;
      uVar11 = uVar11 + 1;
      iVar4 = 1;
      do {
        iVar9 = iVar4;
        iVar4 = iVar9 * 2;
      } while (iVar9 < (int)uVar11);
      while (uVar10 < (ulong)(long)iVar9) {
        _al_vector_alloc_back(vec);
        uVar10 = (ulong)uVar11;
        uVar11 = uVar11 + 1;
      }
      _al_vector_free(&local_58);
    }
    if ((queue->mutex).inited == true) {
      pthread_mutex_unlock((pthread_mutex_t *)&(queue->mutex).mutex);
    }
  }
  return;
}

Assistant:

void al_unregister_event_source(ALLEGRO_EVENT_QUEUE *queue,
   ALLEGRO_EVENT_SOURCE *source)
{
   bool found;
   ASSERT(queue);
   ASSERT(source);

   /* Remove source from our list. */
   _al_mutex_lock(&queue->mutex);
   found = _al_vector_find_and_delete(&queue->sources, &source);
   _al_mutex_unlock(&queue->mutex);

   if (found) {
      /* Tell the event source that it was unregistered. */
      _al_event_source_on_unregistration_from_queue(source, queue);

      /* Drop all the events in the queue that belonged to the source. */
      _al_mutex_lock(&queue->mutex);
      discard_events_of_source(queue, source);
      _al_mutex_unlock(&queue->mutex);
   }
}